

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

char * absl::lts_20250127::anon_unknown_0::EncodeHundred(uint32_t n,Nonnull<char_*> out_str)

{
  uint32_t base;
  uint32_t mod10;
  uint32_t div10;
  int num_digits;
  Nonnull<char_*> out_str_local;
  uint32_t n_local;
  
  little_endian::Store16
            (out_str,(uint16_t)
                     ((int)((ulong)n * 0x67 >> 10) * -0x9ff + 0x3030 + n * 0x100 >>
                     ((byte)(n - 10 >> 8) & 8)));
  return out_str + (long)((int)(n - 10) >> 8) + 2;
}

Assistant:

inline char* EncodeHundred(uint32_t n, absl::Nonnull<char*> out_str) {
  int num_digits = static_cast<int>(n - 10) >> 8;
  uint32_t div10 = (n * kDivisionBy10Mul) / kDivisionBy10Div;
  uint32_t mod10 = n - 10u * div10;
  uint32_t base = kTwoZeroBytes + div10 + (mod10 << 8);
  base >>= num_digits & 8;
  little_endian::Store16(out_str, static_cast<uint16_t>(base));
  return out_str + 2 + num_digits;
}